

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvkgen.cpp
# Opt level: O0

Command * __thiscall VkSpecParser::parseCommand(VkSpecParser *this)

{
  initializer_list<QString> args;
  bool bVar1;
  byte bVar2;
  Command *in_RDI;
  long in_FS_OFFSET;
  undefined1 auVar3 [16];
  QXmlStreamAttribute *attr;
  QXmlStreamAttributes *__range1;
  char16_t *str_5;
  char16_t *str_6;
  char16_t *str_2;
  char16_t *str;
  char16_t *str_1;
  char16_t *str_4;
  char16_t *str_3;
  char16_t *str_7;
  char16_t *str_8;
  QStringList dispatchableDeviceAndChildTypes;
  QString paramStr;
  QString protoStr;
  iterator __end1;
  iterator __begin1;
  QString api;
  Command c;
  undefined4 in_stack_fffffffffffffa78;
  CaseSensitivity in_stack_fffffffffffffa7c;
  Command *in_stack_fffffffffffffa80;
  undefined7 in_stack_fffffffffffffa88;
  undefined1 in_stack_fffffffffffffa8f;
  bool bVar4;
  QStringView *in_stack_fffffffffffffa90;
  undefined1 *puVar5;
  QString *in_stack_fffffffffffffaa0;
  VkSpecParser *in_stack_fffffffffffffaa8;
  long *plVar6;
  long *local_550;
  bool local_539;
  byte local_52a;
  QArrayDataPointer<char16_t> local_3f0 [2];
  QArrayDataPointer<char16_t> local_3c0;
  QArrayDataPointer<char16_t> local_3a8;
  QArrayDataPointer<char16_t> local_390;
  undefined8 local_378;
  undefined8 local_370;
  undefined8 local_368;
  undefined1 local_308 [16];
  undefined1 local_2a0 [16];
  QArrayDataPointer<char16_t> local_290;
  undefined8 local_278;
  undefined8 local_270;
  undefined8 local_268;
  QArrayDataPointer<char16_t> local_260;
  undefined8 local_248;
  undefined8 local_240;
  undefined8 local_238;
  QArrayDataPointer<char16_t> local_230 [2];
  undefined1 local_1f0 [16];
  QArrayDataPointer<char16_t> local_1e0 [2];
  QChar local_1aa;
  undefined1 local_1a8 [24];
  QStringView local_190;
  QArrayDataPointer<char16_t> local_150 [2];
  QStringView local_110;
  QXmlStreamAttribute *local_100;
  iterator local_f8;
  iterator local_f0 [4];
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  Command local_b8;
  long local_50 [3];
  undefined1 auStack_38 [48];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&local_b8,0xaa,0x68);
  Command::Command(in_stack_fffffffffffffa80);
  local_d0 = 0xaaaaaaaaaaaaaaaa;
  local_c8 = 0xaaaaaaaaaaaaaaaa;
  local_c0 = 0xaaaaaaaaaaaaaaaa;
  QString::QString((QString *)0x104104);
  QXmlStreamReader::attributes();
  local_f0[0].i = (QXmlStreamAttribute *)0xaaaaaaaaaaaaaaaa;
  local_f0[0] = QList<QXmlStreamAttribute>::begin
                          ((QList<QXmlStreamAttribute> *)in_stack_fffffffffffffa80);
  local_f8.i = (QXmlStreamAttribute *)0xaaaaaaaaaaaaaaaa;
  local_f8 = QList<QXmlStreamAttribute>::end
                       ((QList<QXmlStreamAttribute> *)in_stack_fffffffffffffa80);
  while( true ) {
    local_100 = local_f8.i;
    bVar1 = QList<QXmlStreamAttribute>::iterator::operator!=(local_f0,local_f8);
    if (!bVar1) break;
    QList<QXmlStreamAttribute>::iterator::operator*(local_f0);
    local_110 = QXmlStreamAttribute::name((QXmlStreamAttribute *)0x1041f3);
    QArrayDataPointer<char16_t>::QArrayDataPointer(local_150,(Data *)0x0,L"api",3);
    QString::QString((QString *)in_stack_fffffffffffffa80,
                     (DataPointer *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
    QStringView::QStringView<QString,_true>
              (in_stack_fffffffffffffa90,
               (QString *)CONCAT17(in_stack_fffffffffffffa8f,in_stack_fffffffffffffa88));
    bVar1 = operator==((QStringView *)in_stack_fffffffffffffa80,
                       (QStringView *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78))
    ;
    QString::~QString((QString *)0x1042a0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)in_stack_fffffffffffffa80);
    if (bVar1) {
      local_190 = QXmlStreamAttribute::value((QXmlStreamAttribute *)0x1042c4);
      QStringView::toString((QStringView *)in_stack_fffffffffffffa80);
      QString::trimmed((QString *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
      QString::operator=((QString *)in_stack_fffffffffffffa80,
                         (QString *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
      QString::~QString((QString *)0x104320);
      QString::~QString((QString *)0x10432d);
    }
    QList<QXmlStreamAttribute>::iterator::operator++(local_f0);
  }
  QXmlStreamAttributes::~QXmlStreamAttributes((QXmlStreamAttributes *)0x1041ba);
  bVar1 = QString::isEmpty((QString *)0x10434e);
  local_52a = 0;
  if (!bVar1) {
    QChar::QChar<char,_true>(&local_1aa,',');
    QFlags<Qt::SplitBehaviorFlags>::QFlags
              ((QFlags<Qt::SplitBehaviorFlags> *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa7c
              );
    QString::split((QChar)(char16_t)local_1a8,(QFlags *)&local_d0,(uint)(ushort)local_1aa.ucs);
    QArrayDataPointer<char16_t>::QArrayDataPointer(local_1e0,(Data *)0x0,L"vulkan",6);
    QString::QString((QString *)in_stack_fffffffffffffa80,
                     (DataPointer *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
    bVar1 = QListSpecialMethods<QString>::contains
                      ((QListSpecialMethods<QString> *)
                       CONCAT17(in_stack_fffffffffffffa8f,in_stack_fffffffffffffa88),
                       (QString *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa7c);
    local_52a = bVar1 ^ 0xff;
    QString::~QString((QString *)0x104480);
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)in_stack_fffffffffffffa80);
    QList<QString>::~QList((QList<QString> *)0x1044b2);
  }
  if ((local_52a & 1) == 0) {
    while( true ) {
      bVar2 = QXmlStreamReader::atEnd();
      if (((bVar2 ^ 0xff) & 1) == 0) break;
      QXmlStreamReader::readNext();
      bVar1 = QXmlStreamReader::isEndElement((QXmlStreamReader *)0x104560);
      local_539 = false;
      if (bVar1) {
        auVar3 = QXmlStreamReader::name();
        local_1f0 = auVar3;
        QArrayDataPointer<char16_t>::QArrayDataPointer(local_230,(Data *)0x0,L"command",7);
        QString::QString((QString *)in_stack_fffffffffffffa80,
                         (DataPointer *)
                         CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
        QStringView::QStringView<QString,_true>
                  (in_stack_fffffffffffffa90,
                   (QString *)CONCAT17(in_stack_fffffffffffffa8f,in_stack_fffffffffffffa88));
        local_539 = operator==((QStringView *)in_stack_fffffffffffffa80,
                               (QStringView *)
                               CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
        QString::~QString((QString *)0x104661);
        QArrayDataPointer<char16_t>::~QArrayDataPointer
                  ((QArrayDataPointer<char16_t> *)in_stack_fffffffffffffa80);
      }
      if (local_539 != false) break;
      bVar1 = QXmlStreamReader::isStartElement((QXmlStreamReader *)0x104697);
      if (bVar1) {
        local_248 = 0xaaaaaaaaaaaaaaaa;
        local_240 = 0xaaaaaaaaaaaaaaaa;
        local_238 = 0xaaaaaaaaaaaaaaaa;
        QArrayDataPointer<char16_t>::QArrayDataPointer(&local_260,(Data *)0x0,L"proto",5);
        QString::QString((QString *)in_stack_fffffffffffffa80,
                         (DataPointer *)
                         CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
        QArrayDataPointer<char16_t>::~QArrayDataPointer
                  ((QArrayDataPointer<char16_t> *)in_stack_fffffffffffffa80);
        local_278 = 0xaaaaaaaaaaaaaaaa;
        local_270 = 0xaaaaaaaaaaaaaaaa;
        local_268 = 0xaaaaaaaaaaaaaaaa;
        QArrayDataPointer<char16_t>::QArrayDataPointer(&local_290,(Data *)0x0,L"param",5);
        QString::QString((QString *)in_stack_fffffffffffffa80,
                         (DataPointer *)
                         CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
        QArrayDataPointer<char16_t>::~QArrayDataPointer
                  ((QArrayDataPointer<char16_t> *)in_stack_fffffffffffffa80);
        auVar3 = QXmlStreamReader::name();
        local_2a0 = auVar3;
        QStringView::QStringView<QString,_true>
                  (in_stack_fffffffffffffa90,
                   (QString *)CONCAT17(in_stack_fffffffffffffa8f,in_stack_fffffffffffffa88));
        bVar1 = operator==((QStringView *)in_stack_fffffffffffffa80,
                           (QStringView *)
                           CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
        if (bVar1) {
          parseParamOrProto(in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0);
          TypedName::operator=
                    (&in_stack_fffffffffffffa80->cmd,
                     (TypedName *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
          TypedName::~TypedName(&in_stack_fffffffffffffa80->cmd);
        }
        else {
          auVar3 = QXmlStreamReader::name();
          local_308 = auVar3;
          QStringView::QStringView<QString,_true>
                    (in_stack_fffffffffffffa90,
                     (QString *)CONCAT17(in_stack_fffffffffffffa8f,in_stack_fffffffffffffa88));
          bVar1 = operator==((QStringView *)in_stack_fffffffffffffa80,
                             (QStringView *)
                             CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
          if (bVar1) {
            parseParamOrProto(in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0);
            QList<VkSpecParser::TypedName>::append
                      ((QList<VkSpecParser::TypedName> *)in_stack_fffffffffffffa80,
                       (rvalue_ref)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
            TypedName::~TypedName(&in_stack_fffffffffffffa80->cmd);
          }
          else {
            skip((VkSpecParser *)in_stack_fffffffffffffa80);
          }
        }
        QString::~QString((QString *)0x10491a);
        QString::~QString((QString *)0x104927);
      }
    }
    local_b8.deviceLevel = false;
    bVar1 = QList<VkSpecParser::TypedName>::isEmpty((QList<VkSpecParser::TypedName> *)0x104945);
    if (!bVar1) {
      local_378 = 0xaaaaaaaaaaaaaaaa;
      local_370 = 0xaaaaaaaaaaaaaaaa;
      local_368 = 0xaaaaaaaaaaaaaaaa;
      QArrayDataPointer<char16_t>::QArrayDataPointer(&local_390,(Data *)0x0,L"VkDevice",8);
      QString::QString((QString *)in_stack_fffffffffffffa80,
                       (DataPointer *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78))
      ;
      puVar5 = auStack_38;
      QArrayDataPointer<char16_t>::QArrayDataPointer(&local_3a8,(Data *)0x0,L"VkQueue",7);
      QString::QString((QString *)in_stack_fffffffffffffa80,
                       (DataPointer *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78))
      ;
      QArrayDataPointer<char16_t>::QArrayDataPointer(&local_3c0,(Data *)0x0,L"VkCommandBuffer",0xf);
      QString::QString((QString *)in_stack_fffffffffffffa80,
                       (DataPointer *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78))
      ;
      args._M_len = (size_type)puVar5;
      args._M_array = (iterator)in_stack_fffffffffffffa90;
      QList<QString>::QList
                ((QList<QString> *)CONCAT17(in_stack_fffffffffffffa8f,in_stack_fffffffffffffa88),
                 args);
      plVar6 = local_50;
      local_550 = &local_8;
      do {
        local_550 = local_550 + -3;
        QString::~QString((QString *)0x104b1e);
      } while (local_550 != plVar6);
      QArrayDataPointer<char16_t>::~QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)in_stack_fffffffffffffa80);
      QArrayDataPointer<char16_t>::~QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)in_stack_fffffffffffffa80);
      QArrayDataPointer<char16_t>::~QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)in_stack_fffffffffffffa80);
      QList<VkSpecParser::TypedName>::operator[]
                ((QList<VkSpecParser::TypedName> *)in_stack_fffffffffffffa80,
                 CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
      bVar1 = QListSpecialMethods<QString>::contains
                        ((QListSpecialMethods<QString> *)
                         CONCAT17(in_stack_fffffffffffffa8f,in_stack_fffffffffffffa88),
                         (QString *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa7c);
      bVar4 = false;
      if (bVar1) {
        in_stack_fffffffffffffa80 = &local_b8;
        QArrayDataPointer<char16_t>::QArrayDataPointer
                  (local_3f0,(Data *)0x0,L"vkGetDeviceProcAddr",0x13);
        QString::QString((QString *)in_stack_fffffffffffffa80,
                         (DataPointer *)
                         CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
        bVar4 = operator!=((QString *)in_stack_fffffffffffffa80,
                           (QString *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78))
        ;
      }
      in_stack_fffffffffffffa7c = CONCAT13(bVar4,(int3)in_stack_fffffffffffffa7c);
      if (bVar1) {
        QString::~QString((QString *)0x104c50);
        QArrayDataPointer<char16_t>::~QArrayDataPointer
                  ((QArrayDataPointer<char16_t> *)in_stack_fffffffffffffa80);
      }
      if ((in_stack_fffffffffffffa7c & 0x1000000) != CaseInsensitive) {
        local_b8.deviceLevel = true;
      }
      QList<QString>::~QList((QList<QString> *)0x104c85);
    }
    Command::Command(in_stack_fffffffffffffa80,
                     (Command *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
  }
  else {
    skip((VkSpecParser *)in_stack_fffffffffffffa80);
    QString::QString((QString *)0x1044d0);
    QString::QString((QString *)0x1044de);
    QString::QString((QString *)0x1044ec);
    memset(&in_RDI->args,0,0x18);
    QList<VkSpecParser::TypedName>::QList((QList<VkSpecParser::TypedName> *)0x104510);
    in_RDI->deviceLevel = false;
  }
  QString::~QString((QString *)0x104caf);
  Command::~Command(in_stack_fffffffffffffa80);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

VkSpecParser::Command VkSpecParser::parseCommand()
{
    Command c;

    // <command successcodes="VK_SUCCESS" ...>
    //   <proto><type>VkResult</type> <name>vkCreateInstance</name></proto>
    //   <param>const <type>VkInstanceCreateInfo</type>* <name>pCreateInfo</name></param>
    //   <param optional="true">const <type>VkAllocationCallbacks</type>* <name>pAllocator</name></param>
    //   <param><type>VkInstance</type>* <name>pInstance</name></param>

    QString api;
    for (const QXmlStreamAttribute &attr : m_reader.attributes()) {
        if (attr.name() == QStringLiteral("api"))
            api = attr.value().toString().trimmed();
    }
    // skip commands with api="vulkansc", but the api attribute is optional
    if (!api.isEmpty() && !api.split(',').contains(QStringLiteral("vulkan"))) {
        skip();
        return {};
    }

    while (!m_reader.atEnd()) {
        m_reader.readNext();
        if (m_reader.isEndElement() && m_reader.name() == QStringLiteral("command"))
            break;
        if (m_reader.isStartElement()) {
            const QString protoStr = QStringLiteral("proto");
            const QString paramStr = QStringLiteral("param");
            if (m_reader.name() == protoStr) {
                c.cmd = parseParamOrProto(protoStr);
            } else if (m_reader.name() == paramStr) {
                c.args.append(parseParamOrProto(paramStr));
            } else {
                skip();
            }
        }
    }

    c.deviceLevel = false;
    if (!c.args.isEmpty()) {
        QStringList dispatchableDeviceAndChildTypes {
            QStringLiteral("VkDevice"),
            QStringLiteral("VkQueue"),
            QStringLiteral("VkCommandBuffer")
        };
        if (dispatchableDeviceAndChildTypes.contains(c.args[0].type)
                && c.cmd.name != QStringLiteral("vkGetDeviceProcAddr"))
        {
            c.deviceLevel = true;
        }
    }

    return c;
}